

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O2

void __thiscall IMLE::modelDisplay(IMLE *this,ostream *out)

{
  ostream *poVar1;
  long lVar2;
  long lVar3;
  
  poVar1 = std::operator<<(out,"-----------------------    Experts   ----");
  std::endl<char,std::char_traits<char>>(poVar1);
  lVar2 = 0;
  lVar3 = 0;
  while (lVar3 < this->M) {
    poVar1 = std::operator<<(out,"------ #");
    lVar3 = lVar3 + 1;
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)lVar3);
    poVar1 = std::operator<<(poVar1,":");
    std::endl<char,std::char_traits<char>>(poVar1);
    FastLinearExpert::modelDisplay
              ((FastLinearExpert *)
               ((long)&(((this->experts).
                         super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                         .
                         super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                         ._M_impl.super__Vector_impl_data._M_start)->super_LinearExpert).d + lVar2),
               out);
    std::endl<char,std::char_traits<char>>(out);
    lVar2 = lVar2 + 0x308;
  }
  poVar1 = std::operator<<(out,"-----------------------    Common    ----");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"M= ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->M);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"Sigma= ");
  poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                    &this->Sigma);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"Psi= ");
  poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->Psi
                            );
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::modelDisplay(std::ostream &out) const
{
    out << "-----------------------    Experts   ----" << std::endl;
   for(int i = 0; i < M; i++)
    {
        out << "------ #" << i+1 << ":" << std::endl;
        experts[i].modelDisplay(out);
        out << std::endl;
    }

    out << "-----------------------    Common    ----" << std::endl;
    out << EXPAND( M ) << std::endl;
    out << EXPAND(Sigma) << std::endl;
    out << EXPAND(Psi) << std::endl;

}